

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O0

bool __thiscall Assimp::MD3Importer::ReadMultipartFile(MD3Importer *this)

{
  undefined8 uVar1;
  bool bVar2;
  __type _Var3;
  long lVar4;
  Logger *pLVar5;
  aiNode *paVar6;
  aiScene *_scene;
  DeadlyImportError *this_00;
  allocator<char> local_441;
  string local_440;
  int local_41c;
  aiMatrix4x4t<float> local_418;
  aiMatrix4x4t<float> local_3d8;
  aiMatrix4x4t<float> local_398;
  aiMatrix4x4t<float> local_358;
  AttachmentInfo local_318;
  AttachmentInfo local_308;
  AttachmentInfo local_2f8;
  aiNode *local_2e8;
  aiNode *nd;
  aiScene *master;
  uint local_2d0;
  uint _head;
  uint _upper;
  uint _lower;
  BatchLoader batch;
  undefined1 local_2b8 [8];
  PropertyMap props;
  vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> attach;
  aiNode *tag_head;
  aiNode *tag_torso;
  string failure;
  aiScene *scene_head;
  aiScene *scene_lower;
  aiScene *scene_upper;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [8];
  string head;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  string upper;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string lower;
  undefined1 local_68 [8];
  string suffix;
  string mod_filename;
  size_type t;
  size_type s;
  MD3Importer *this_local;
  
  std::__cxx11::string::find_last_of((char)this + ' ',0x5f);
  lVar4 = std::__cxx11::string::find_last_of((char)this + ' ',0x2e);
  if (lVar4 == -1) {
    std::__cxx11::string::size();
  }
  std::__cxx11::string::substr((ulong)((long)&suffix.field_2 + 8),(ulong)&this->filename);
  std::__cxx11::string::substr((ulong)local_68,(ulong)&this->filename);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&suffix.field_2 + 8),"lower");
  if (((bVar2) ||
      (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&suffix.field_2 + 8),"upper"), bVar2)) ||
     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&suffix.field_2 + 8),"head"), bVar2)) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&upper.field_2 + 8),&this->path,"lower");
    std::operator+(&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&upper.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   &local_b8,".md3");
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)(upper.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&head.field_2 + 8),&this->path,"upper");
    std::operator+(&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&head.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   &local_118,".md3");
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)(head.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scene_upper
                   ,&this->path,"head");
    std::operator+(&local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scene_upper
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   &local_178,".md3");
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&scene_upper);
    scene_lower = (aiScene *)0x0;
    failure.field_2._8_8_ = 0;
    std::__cxx11::string::string((string *)&tag_torso);
    std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::vector
              ((vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *)
               &props.matrices._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pLVar5 = DefaultLogger::get();
    Logger::info(pLVar5,"Multi part MD3 player model: lower, upper and head parts are joined");
    BatchLoader::PropertyMap::PropertyMap((PropertyMap *)local_2b8);
    batch.m_data._4_4_ = 0;
    SetGenericProperty<int>
              ((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                *)local_2b8,"IMPORT_MD3_HANDLE_MULTIPART",(int *)((long)&batch.m_data + 4));
    BatchLoader::BatchLoader((BatchLoader *)&_upper,this->mIOHandler,false);
    _head = BatchLoader::AddLoadRequest
                      ((BatchLoader *)&_upper,(string *)local_98,0,(PropertyMap *)local_2b8);
    local_2d0 = BatchLoader::AddLoadRequest
                          ((BatchLoader *)&_upper,(string *)local_f8,0,(PropertyMap *)local_2b8);
    master._4_4_ = BatchLoader::AddLoadRequest
                             ((BatchLoader *)&_upper,(string *)local_158,0,(PropertyMap *)local_2b8)
    ;
    BatchLoader::LoadAll((BatchLoader *)&_upper);
    paVar6 = (aiNode *)operator_new(0x80);
    aiScene::aiScene((aiScene *)paVar6);
    nd = paVar6;
    paVar6 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar6);
    *(aiNode **)((nd->mName).data + 4) = paVar6;
    local_2e8 = paVar6;
    aiString::Set((aiString *)paVar6,"<MD3_Player>");
    _scene = BatchLoader::GetImport((BatchLoader *)&_upper,_head);
    if (_scene == (aiScene *)0x0) {
      pLVar5 = DefaultLogger::get();
      Logger::error(pLVar5,"M3D: Failed to read multi part model, lower.md3 fails to load");
      std::__cxx11::string::operator=((string *)&tag_torso,"lower");
LAB_006ce751:
      if (scene_lower != (aiScene *)0x0) {
        aiScene::~aiScene(scene_lower);
        operator_delete(scene_lower,0x80);
      }
      if (_scene != (aiScene *)0x0) {
        aiScene::~aiScene(_scene);
        operator_delete(_scene,0x80);
      }
      uVar1 = failure.field_2._8_8_;
      if (failure.field_2._8_8_ != 0) {
        aiScene::~aiScene((aiScene *)failure.field_2._8_8_);
        operator_delete((void *)uVar1,0x80);
      }
      paVar6 = nd;
      if (nd != (aiNode *)0x0) {
        aiScene::~aiScene((aiScene *)nd);
        operator_delete(paVar6,0x80);
      }
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &tag_torso,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&suffix.field_2 + 8));
      if (_Var3) {
        this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_440,"MD3: failure to read multipart host file",&local_441);
        DeadlyImportError::DeadlyImportError(this_00,&local_440);
        __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      local_41c = 0;
    }
    else {
      scene_lower = BatchLoader::GetImport((BatchLoader *)&_upper,local_2d0);
      if (scene_lower == (aiScene *)0x0) {
        pLVar5 = DefaultLogger::get();
        Logger::error(pLVar5,"M3D: Failed to read multi part model, upper.md3 fails to load");
        std::__cxx11::string::operator=((string *)&tag_torso,"upper");
        goto LAB_006ce751;
      }
      failure.field_2._8_8_ = BatchLoader::GetImport((BatchLoader *)&_upper,master._4_4_);
      if ((aiScene *)failure.field_2._8_8_ == (aiScene *)0x0) {
        pLVar5 = DefaultLogger::get();
        Logger::error(pLVar5,"M3D: Failed to read multi part model, head.md3 fails to load");
        std::__cxx11::string::operator=((string *)&tag_torso,"head");
        goto LAB_006ce751;
      }
      aiString::Set(&_scene->mRootNode->mName,"lower");
      AttachmentInfo::AttachmentInfo(&local_2f8,_scene,local_2e8);
      std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::push_back
                ((vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *)
                 &props.matrices._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_2f8);
      paVar6 = aiNode::FindNode(_scene->mRootNode,"tag_torso");
      if (paVar6 == (aiNode *)0x0) {
        pLVar5 = DefaultLogger::get();
        Logger::error(pLVar5,
                      "M3D: Failed to find attachment tag for multi part model: tag_torso expected")
        ;
        goto LAB_006ce751;
      }
      aiString::Set(&scene_lower->mRootNode->mName,"upper");
      AttachmentInfo::AttachmentInfo(&local_308,scene_lower,paVar6);
      std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::push_back
                ((vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *)
                 &props.matrices._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_308);
      paVar6 = aiNode::FindNode(scene_lower->mRootNode,"tag_head");
      if (paVar6 == (aiNode *)0x0) {
        pLVar5 = DefaultLogger::get();
        Logger::error(pLVar5,
                      "M3D: Failed to find attachment tag for multi part model: tag_head expected");
        goto LAB_006ce751;
      }
      aiString::Set(*(aiString **)(failure.field_2._8_8_ + 8),"head");
      AttachmentInfo::AttachmentInfo(&local_318,(aiScene *)failure.field_2._8_8_,paVar6);
      std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::push_back
                ((vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *)
                 &props.matrices._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_318);
      paVar6 = aiNode::FindNode(scene_lower->mRootNode,"tag_torso");
      RemoveSingleNodeFromList(paVar6);
      paVar6 = aiNode::FindNode(*(aiNode **)(failure.field_2._8_8_ + 8),"tag_head");
      RemoveSingleNodeFromList(paVar6);
      aiMatrix4x4t<float>::aiMatrix4x4t(&local_358);
      lVar4 = *(long *)(failure.field_2._8_8_ + 8);
      *(undefined8 *)(lVar4 + 0x434) = local_358._48_8_;
      *(undefined8 *)(lVar4 + 0x43c) = local_358._56_8_;
      *(undefined8 *)(lVar4 + 0x424) = local_358._32_8_;
      *(undefined8 *)(lVar4 + 0x42c) = local_358._40_8_;
      *(undefined8 *)(lVar4 + 0x414) = local_358._16_8_;
      *(undefined8 *)(lVar4 + 0x41c) = local_358._24_8_;
      *(undefined8 *)(lVar4 + 0x404) = local_358._0_8_;
      *(undefined8 *)(lVar4 + 0x40c) = local_358._8_8_;
      aiMatrix4x4t<float>::aiMatrix4x4t(&local_398);
      paVar6 = _scene->mRootNode;
      (paVar6->mTransformation).d1 = local_398.d1;
      (paVar6->mTransformation).d2 = local_398.d2;
      (paVar6->mTransformation).d3 = local_398.d3;
      (paVar6->mTransformation).d4 = local_398.d4;
      (paVar6->mTransformation).c1 = local_398.c1;
      (paVar6->mTransformation).c2 = local_398.c2;
      (paVar6->mTransformation).c3 = local_398.c3;
      (paVar6->mTransformation).c4 = local_398.c4;
      (paVar6->mTransformation).b1 = local_398.b1;
      (paVar6->mTransformation).b2 = local_398.b2;
      (paVar6->mTransformation).b3 = local_398.b3;
      (paVar6->mTransformation).b4 = local_398.b4;
      (paVar6->mTransformation).a1 = local_398.a1;
      (paVar6->mTransformation).a2 = local_398.a2;
      (paVar6->mTransformation).a3 = local_398.a3;
      (paVar6->mTransformation).a4 = local_398.a4;
      aiMatrix4x4t<float>::aiMatrix4x4t(&local_3d8);
      paVar6 = scene_lower->mRootNode;
      (paVar6->mTransformation).d1 = local_3d8.d1;
      (paVar6->mTransformation).d2 = local_3d8.d2;
      (paVar6->mTransformation).d3 = local_3d8.d3;
      (paVar6->mTransformation).d4 = local_3d8.d4;
      (paVar6->mTransformation).c1 = local_3d8.c1;
      (paVar6->mTransformation).c2 = local_3d8.c2;
      (paVar6->mTransformation).c3 = local_3d8.c3;
      (paVar6->mTransformation).c4 = local_3d8.c4;
      (paVar6->mTransformation).b1 = local_3d8.b1;
      (paVar6->mTransformation).b2 = local_3d8.b2;
      (paVar6->mTransformation).b3 = local_3d8.b3;
      (paVar6->mTransformation).b4 = local_3d8.b4;
      (paVar6->mTransformation).a1 = local_3d8.a1;
      (paVar6->mTransformation).a2 = local_3d8.a2;
      (paVar6->mTransformation).a3 = local_3d8.a3;
      (paVar6->mTransformation).a4 = local_3d8.a4;
      SceneCombiner::MergeScenes
                (&this->mScene,(aiScene *)nd,
                 (vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *)
                 &props.matrices._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 ((byte)~this->configSpeedFlag & 1) << 4 | 0xb);
      aiMatrix4x4t<float>::aiMatrix4x4t
                (&local_418,1.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,-1.0,0.0,0.0,0.0,0.0,0.0,1.0);
      memcpy(&this->mScene->mRootNode->mTransformation,&local_418,0x40);
      this_local._7_1_ = 1;
      local_41c = 1;
    }
    BatchLoader::~BatchLoader((BatchLoader *)&_upper);
    BatchLoader::PropertyMap::~PropertyMap((PropertyMap *)local_2b8);
    std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::~vector
              ((vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *)
               &props.matrices._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&tag_torso);
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string((string *)local_f8);
    std::__cxx11::string::~string((string *)local_98);
    if (local_41c != 0) goto LAB_006ce9cb;
  }
  this_local._7_1_ = 0;
  local_41c = 1;
LAB_006ce9cb:
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MD3Importer::ReadMultipartFile()
{
    // check whether the file name contains a common postfix, e.g lower_2.md3
    std::string::size_type s = filename.find_last_of('_'), t = filename.find_last_of('.');

    if (t == std::string::npos)
        t = filename.size();
    if (s == std::string::npos)
        s = t;

    const std::string mod_filename = filename.substr(0,s);
    const std::string suffix = filename.substr(s,t-s);

    if (mod_filename == "lower" || mod_filename == "upper" || mod_filename == "head"){
        const std::string lower = path + "lower" + suffix + ".md3";
        const std::string upper = path + "upper" + suffix + ".md3";
        const std::string head  = path + "head"  + suffix + ".md3";

        aiScene* scene_upper = NULL;
        aiScene* scene_lower = NULL;
        aiScene* scene_head = NULL;
        std::string failure;

        aiNode* tag_torso, *tag_head;
        std::vector<AttachmentInfo> attach;

        ASSIMP_LOG_INFO("Multi part MD3 player model: lower, upper and head parts are joined");

        // ensure we won't try to load ourselves recursively
        BatchLoader::PropertyMap props;
        SetGenericProperty( props.ints, AI_CONFIG_IMPORT_MD3_HANDLE_MULTIPART, 0);

        // now read these three files
        BatchLoader batch(mIOHandler);
        const unsigned int _lower = batch.AddLoadRequest(lower,0,&props);
        const unsigned int _upper = batch.AddLoadRequest(upper,0,&props);
        const unsigned int _head  = batch.AddLoadRequest(head,0,&props);
        batch.LoadAll();

        // now construct a dummy scene to place these three parts in
        aiScene* master   = new aiScene();
        aiNode* nd = master->mRootNode = new aiNode();
        nd->mName.Set("<MD3_Player>");

        // ... and get them. We need all of them.
        scene_lower = batch.GetImport(_lower);
        if (!scene_lower) {
            ASSIMP_LOG_ERROR("M3D: Failed to read multi part model, lower.md3 fails to load");
            failure = "lower";
            goto error_cleanup;
        }

        scene_upper = batch.GetImport(_upper);
        if (!scene_upper) {
            ASSIMP_LOG_ERROR("M3D: Failed to read multi part model, upper.md3 fails to load");
            failure = "upper";
            goto error_cleanup;
        }

        scene_head  = batch.GetImport(_head);
        if (!scene_head) {
            ASSIMP_LOG_ERROR("M3D: Failed to read multi part model, head.md3 fails to load");
            failure = "head";
            goto error_cleanup;
        }

        // build attachment infos. search for typical Q3 tags

        // original root
        scene_lower->mRootNode->mName.Set("lower");
        attach.push_back(AttachmentInfo(scene_lower, nd));

        // tag_torso
        tag_torso = scene_lower->mRootNode->FindNode("tag_torso");
        if (!tag_torso) {
            ASSIMP_LOG_ERROR("M3D: Failed to find attachment tag for multi part model: tag_torso expected");
            goto error_cleanup;
        }
        scene_upper->mRootNode->mName.Set("upper");
        attach.push_back(AttachmentInfo(scene_upper,tag_torso));

        // tag_head
        tag_head = scene_upper->mRootNode->FindNode("tag_head");
        if (!tag_head) {
            ASSIMP_LOG_ERROR( "M3D: Failed to find attachment tag for multi part model: tag_head expected");
            goto error_cleanup;
        }
        scene_head->mRootNode->mName.Set("head");
        attach.push_back(AttachmentInfo(scene_head,tag_head));

        // Remove tag_head and tag_torso from all other model parts ...
        // this ensures (together with AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY)
        // that tag_torso/tag_head is also the name of the (unique) output node
        RemoveSingleNodeFromList (scene_upper->mRootNode->FindNode("tag_torso"));
        RemoveSingleNodeFromList (scene_head-> mRootNode->FindNode("tag_head" ));

        // Undo the rotations which we applied to the coordinate systems. We're
        // working in global Quake space here
        scene_head->mRootNode->mTransformation  = aiMatrix4x4();
        scene_lower->mRootNode->mTransformation = aiMatrix4x4();
        scene_upper->mRootNode->mTransformation = aiMatrix4x4();

        // and merge the scenes
        SceneCombiner::MergeScenes(&mScene,master, attach,
            AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES          |
            AI_INT_MERGE_SCENE_GEN_UNIQUE_MATNAMES       |
            AI_INT_MERGE_SCENE_RESOLVE_CROSS_ATTACHMENTS |
            (!configSpeedFlag ? AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY : 0));

        // Now rotate the whole scene 90 degrees around the x axis to convert to internal coordinate system
        mScene->mRootNode->mTransformation = aiMatrix4x4(1.f,0.f,0.f,0.f,
            0.f,0.f,1.f,0.f,0.f,-1.f,0.f,0.f,0.f,0.f,0.f,1.f);

        return true;

error_cleanup:
        delete scene_upper;
        delete scene_lower;
        delete scene_head;
        delete master;

        if (failure == mod_filename) {
            throw DeadlyImportError("MD3: failure to read multipart host file");
        }
    }
    return false;
}